

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

string * __thiscall
ThreadTrackerItem::getAggrStackName_abi_cxx11_
          (string *__return_storage_ptr__,ThreadTrackerItem *this)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  
  (this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[this->lenName] = '\0';
  __s = (this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__s == (char *)0x0) {
    pcVar2 = (char *)0x1;
  }
  else {
    sVar1 = strlen(__s);
    pcVar2 = __s + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getAggrStackName() {
        aggrStackNameRaw[lenName] = 0;
        return &aggrStackNameRaw[0];
    }